

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O1

int bitmap_bit_p(const_bitmap_t bm,size_t nb)

{
  MIR_insn_t *ppMVar1;
  uint uVar2;
  bb_insn_t pbVar3;
  int iVar4;
  
  if (bm != (const_bitmap_t)0x0) {
    uVar2 = 0;
    if (nb < bm->els_num << 6) {
      uVar2 = (uint)(bm->varr[nb >> 6] >> (nb & 0x3f)) & 1;
    }
    return uVar2;
  }
  bitmap_bit_p_cold_1();
  if (((bb_t_conflict)nb)->index != 2) {
    if (((FILE *)((gen_ctx_t)bm)->debug_file != (FILE *)0x0) && (1 < ((gen_ctx_t)bm)->debug_level))
    {
      fprintf((FILE *)((gen_ctx_t)bm)->debug_file,"  BB%lu is unreachable and removed\n");
    }
    pbVar3 = (((bb_t_conflict)nb)->bb_insns).head;
    iVar4 = 0;
    while (pbVar3 != (bb_insn_t)0x0) {
      ppMVar1 = &pbVar3->insn;
      pbVar3 = (pbVar3->bb_insn_link).next;
      gen_delete_insn((gen_ctx_t)bm,*ppMVar1);
      iVar4 = iVar4 + 1;
    }
    delete_bb((gen_ctx_t)bm,(bb_t_conflict)nb);
    return iVar4;
  }
  __assert_fail("bb->index != 2",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1051,"long remove_bb(gen_ctx_t, bb_t)");
}

Assistant:

static inline int bitmap_bit_p (const_bitmap_t bm, size_t nb) {
  size_t nw, sh, len = VARR_LENGTH (bitmap_el_t, bm);
  bitmap_el_t *addr = VARR_ADDR (bitmap_el_t, bm);

  if (nb >= BITMAP_WORD_BITS * len) return 0;
  nw = nb / BITMAP_WORD_BITS;
  sh = nb % BITMAP_WORD_BITS;
  return (addr[nw] >> sh) & 1;
}